

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_encoding.cc
# Opt level: O1

bool draco::EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<16>>
               (uint32_t *symbols,int num_values,uint32_t max_entry_value,
               EncoderBuffer *target_buffer)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> frequencies;
  allocator_type local_79;
  RAnsSymbolEncoder<16> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  local_78.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_38,(ulong)(max_entry_value + 1),(value_type_conflict8 *)&local_78,&local_79);
  if (0 < num_values) {
    uVar4 = 0;
    do {
      local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[symbols[uVar4]] =
           local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[symbols[uVar4]] + 1;
      uVar4 = uVar4 + 1;
    } while ((uint)num_values != uVar4);
  }
  local_78.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_78.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_78.num_symbols_ = 0;
  local_78.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_78.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_78.num_expected_bits_ = 0;
  local_78.ans_.ans_.buf = (uint8_t *)0x0;
  local_78.ans_.ans_.buf_offset = 0;
  local_78.ans_.ans_.state = 0;
  local_78.buffer_offset_ = 0;
  RAnsSymbolEncoder<16>::Create
            (&local_78,
             local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (int)((ulong)((long)local_38.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_38.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3),target_buffer);
  local_78.buffer_offset_ =
       (long)(target_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(target_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  EncoderBuffer::Resize
            (target_buffer,
             (local_78.num_expected_bits_ * 2 + 0x27 >> 3) + local_78.buffer_offset_ + 8);
  local_78.ans_.ans_.buf =
       (uint8_t *)
       ((target_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start + local_78.buffer_offset_);
  local_78.ans_.ans_.buf_offset = 0;
  local_78.ans_.ans_.state = 0x400000;
  uVar4 = (ulong)(uint)num_values;
  if (0 < num_values) {
    do {
      uVar1 = symbols[uVar4 - 1];
      uVar2 = local_78.probability_table_.
              super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
              super__Vector_impl_data._M_start[uVar1].prob;
      for (; uVar2 << 10 <= local_78.ans_.ans_.state;
          local_78.ans_.ans_.state = local_78.ans_.ans_.state >> 8) {
        lVar5 = (long)local_78.ans_.ans_.buf_offset;
        local_78.ans_.ans_.buf_offset = local_78.ans_.ans_.buf_offset + 1;
        local_78.ans_.ans_.buf[lVar5] = (uint8_t)local_78.ans_.ans_.state;
      }
      local_78.ans_.ans_.state =
           (local_78.ans_.ans_.state / uVar2) * 0x100000 + local_78.ans_.ans_.state % uVar2 +
           local_78.probability_table_.
           super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1].cum_prob;
      bVar3 = 1 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar3);
  }
  RAnsSymbolEncoder<16>::EndEncoding(&local_78,target_buffer);
  if (local_78.probability_table_.
      super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.probability_table_.
                    super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_78.probability_table_.
                             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_78.probability_table_.
                             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_78.probability_table_.
                          super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (uint64_t *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool EncodeRawSymbolsInternal(const uint32_t *symbols, int num_values,
                              uint32_t max_entry_value,
                              EncoderBuffer *target_buffer) {
  // Count the frequency of each entry value.
  std::vector<uint64_t> frequencies(max_entry_value + 1, 0);
  for (int i = 0; i < num_values; ++i) {
    ++frequencies[symbols[i]];
  }

  SymbolEncoderT encoder;
  encoder.Create(frequencies.data(), static_cast<int>(frequencies.size()),
                 target_buffer);
  encoder.StartEncoding(target_buffer);
  // Encode all values.
  if (SymbolEncoderT::needs_reverse_encoding()) {
    for (int i = num_values - 1; i >= 0; --i) {
      encoder.EncodeSymbol(symbols[i]);
    }
  } else {
    for (int i = 0; i < num_values; ++i) {
      encoder.EncodeSymbol(symbols[i]);
    }
  }
  encoder.EndEncoding(target_buffer);
  return true;
}